

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

void Gia_ManResubTest3(void)

{
  int nDivs;
  void **ppDivs;
  word local_78;
  word Truth;
  int *pArray;
  int local_60;
  int ArraySize;
  int k;
  int i;
  Vec_Int_t *vRes;
  Vec_Ptr_t *vDivs;
  word Divs [6];
  int fVerbose;
  int nVars;
  
  memset(&vDivs,0,0x30);
  Divs[1] = 0xaaaaaaaaaaaaaaaa;
  Divs[2] = 0xcccccccccccccccc;
  Divs[3] = 0xf0f0f0f0f0f0f0f0;
  Divs[4] = 0xff00ff00ff00ff00;
  vRes = (Vec_Int_t *)Vec_PtrAlloc(6);
  _k = Vec_IntAlloc(100);
  for (ArraySize = 0; ArraySize < 6; ArraySize = ArraySize + 1) {
    Vec_PtrPush((Vec_Ptr_t *)vRes,Divs + (long)ArraySize + -1);
  }
  Abc_ResubPrepareManager(1);
  for (ArraySize = 0; ArraySize < 0x10000; ArraySize = ArraySize + 1) {
    local_78 = Abc_Tt6Stretch((long)ArraySize,4);
    vDivs = (Vec_Ptr_t *)(local_78 ^ 0xffffffffffffffff);
    Divs[0] = local_78;
    printf("%3d : ",(ulong)(uint)ArraySize);
    Extra_PrintHex(_stdout,(uint *)&local_78,4);
    printf(" ");
    Dau_DsdPrintFromTruth2(&local_78,4);
    printf("           ");
    ppDivs = Vec_PtrArray((Vec_Ptr_t *)vRes);
    nDivs = Vec_PtrSize((Vec_Ptr_t *)vRes);
    pArray._4_4_ = Abc_ResubComputeFunction(ppDivs,nDivs,1,0x10,0x32,0,0,1,1,(int **)&Truth);
    printf("\n");
    Vec_IntClear(_k);
    for (local_60 = 0; local_60 < pArray._4_4_; local_60 = local_60 + 1) {
      Vec_IntPush(_k,*(int *)(Truth + (long)local_60 * 4));
    }
    if (ArraySize == 1000) break;
  }
  Abc_ResubPrepareManager(0);
  Vec_IntFree(_k);
  Vec_PtrFree((Vec_Ptr_t *)vRes);
  return;
}

Assistant:

void Gia_ManResubTest3()
{
    int nVars = 4;
    int fVerbose = 1;
    word Divs[6] = { 0, 0, 
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00) 
    };
    Vec_Ptr_t * vDivs = Vec_PtrAlloc( 6 );
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    int i, k, ArraySize, * pArray; 
    for ( i = 0; i < 6; i++ )
        Vec_PtrPush( vDivs, Divs+i );
    Abc_ResubPrepareManager( 1 );
    for ( i = 0; i < (1<<(1<<nVars)); i++ ) //if ( i == 0xCA ) 
    {
        word Truth = Abc_Tt6Stretch( i, nVars );
        Divs[0] = ~Truth;
        Divs[1] =  Truth;
        printf( "%3d : ", i );
        Extra_PrintHex( stdout, (unsigned*)&Truth, nVars );
        printf( " " );
        Dau_DsdPrintFromTruth2( &Truth, nVars );
        printf( "           " );

        //Abc_ResubDumpProblem( "temp.resub", (void **)Vec_PtrArray(vDivs), Vec_PtrSize(vDivs), 1 );
        ArraySize = Abc_ResubComputeFunction( (void **)Vec_PtrArray(vDivs), Vec_PtrSize(vDivs), 1, 16, 50, 0, 0, 1, fVerbose, &pArray );
        printf( "\n" );

        Vec_IntClear( vRes );
        for ( k = 0; k < ArraySize; k++ )
            Vec_IntPush( vRes, pArray[k] );

        if ( i == 1000 )
            break;
    }
    Abc_ResubPrepareManager( 0 );
    Vec_IntFree( vRes );
    Vec_PtrFree( vDivs );
}